

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O1

sexp sexp_bignum_mul(sexp ctx,sexp dst,sexp a,sexp b)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  sexp psVar3;
  undefined1 *puVar4;
  ulong k;
  sexp z1;
  sexp z0;
  sexp b0;
  sexp b1;
  sexp a1;
  sexp z2;
  sexp a0;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp_gc_var_t __sexp_gc_preserver7;
  sexp_gc_var_t __sexp_gc_preserver6;
  sexp_gc_var_t __sexp_gc_preserver5;
  sexp_gc_var_t __sexp_gc_preserver4;
  sexp_gc_var_t __sexp_gc_preserver3;
  sexp_gc_var_t __sexp_gc_preserver2;
  sexp local_e8;
  sexp local_e0;
  sexp local_d8;
  sexp local_d0;
  sexp local_c8;
  sexp local_c0;
  sexp local_b8;
  ulong local_b0;
  sexp_gc_var_t local_a8;
  sexp_gc_var_t local_98;
  sexp_gc_var_t local_88;
  sexp_gc_var_t local_78;
  sexp_gc_var_t local_68;
  sexp_gc_var_t local_58;
  sexp_gc_var_t local_48;
  
  puVar1 = (undefined1 *)((long)&((a->value).type.cpl)->tag + 2);
  do {
    puVar2 = puVar1;
    if (puVar2 == (undefined1 *)0x3) {
      puVar2 = (undefined1 *)0x1;
      goto LAB_0011a20e;
    }
    puVar1 = puVar2 + -1;
  } while (*(long *)(&a->tag + (long)puVar2 * 2) == 0);
  puVar2 = puVar2 + -2;
LAB_0011a20e:
  puVar1 = (undefined1 *)((long)&((b->value).type.cpl)->tag + 2);
  do {
    puVar4 = puVar1;
    if (puVar4 == (undefined1 *)0x3) {
      puVar4 = (undefined1 *)0x1;
      goto LAB_0011a235;
    }
    puVar1 = puVar4 + -1;
  } while (*(long *)(&b->tag + (long)puVar4 * 2) == 0);
  puVar4 = puVar4 + -2;
LAB_0011a235:
  local_b8 = (sexp)&DAT_0000043e;
  local_a8.var = (sexp_conflict *)0x0;
  local_a8.next = (sexp_gc_var_t *)0x0;
  local_c8 = (sexp)&DAT_0000043e;
  local_48.var = (sexp_conflict *)0x0;
  local_48.next = (sexp_gc_var_t *)0x0;
  local_d8 = (sexp)&DAT_0000043e;
  local_58.var = (sexp_conflict *)0x0;
  local_58.next = (sexp_gc_var_t *)0x0;
  local_d0 = (sexp)&DAT_0000043e;
  local_68.var = (sexp_conflict *)0x0;
  local_68.next = (sexp_gc_var_t *)0x0;
  local_e0 = (sexp)0x43e;
  local_78.var = (sexp_conflict *)0x0;
  local_78.next = (sexp_gc_var_t *)0x0;
  local_e8 = (sexp)0x43e;
  local_88.var = (sexp_conflict *)0x0;
  local_88.next = (sexp_gc_var_t *)0x0;
  local_c0 = (sexp)0x43e;
  local_98.var = (sexp_conflict *)0x0;
  local_98.next = (sexp_gc_var_t *)0x0;
  if (puVar2 < puVar4) {
    psVar3 = sexp_bignum_mul(ctx,dst,b,a);
    return psVar3;
  }
  if (puVar4 == (undefined1 *)0x1) {
    local_e8 = sexp_bignum_fxmul(ctx,dst,a,(b->value).string.length,0);
  }
  else {
    local_a8.var = &local_b8;
    local_48.next = &local_a8;
    local_a8.next = (ctx->value).context.saves;
    (ctx->value).context.saves = local_48.next;
    local_48.var = &local_c8;
    local_58.next = &local_48;
    (ctx->value).context.saves = local_58.next;
    local_58.var = &local_d8;
    local_68.next = &local_58;
    (ctx->value).context.saves = local_68.next;
    local_68.var = &local_d0;
    local_78.next = &local_68;
    (ctx->value).context.saves = local_78.next;
    local_78.var = &local_e0;
    local_88.next = &local_78;
    (ctx->value).context.saves = local_88.next;
    local_98.next = &local_88;
    (ctx->value).context.saves = local_98.next;
    local_98.var = &local_c0;
    (ctx->value).context.saves = &local_98;
    k = (ulong)puVar4 >> 1;
    local_b0 = k;
    local_88.var = &local_e8;
    sexp_bignum_split(ctx,a,k,local_a8.var,local_48.var);
    sexp_bignum_split(ctx,b,k,&local_d8,&local_d0);
    local_e0 = sexp_bignum_add(ctx,(sexp)0x0,local_c8,local_b8);
    local_e8 = sexp_bignum_add(ctx,(sexp)0x0,local_d0,local_d8);
    local_e8 = sexp_bignum_mul(ctx,(sexp)0x0,local_e8,local_e0);
    local_e0 = sexp_bignum_mul(ctx,(sexp)0x0,local_b8,local_d8);
    local_c0 = sexp_bignum_mul(ctx,(sexp)0x0,local_c8,local_d0);
    local_e8 = sexp_bignum_sub(ctx,(sexp)0x0,local_e8,local_e0);
    local_e8 = sexp_bignum_sub(ctx,(sexp)0x0,local_e8,local_c0);
    local_c0 = sexp_bignum_shift(ctx,local_c0,(ulong)puVar4 & 0xfffffffffffffffe);
    local_e8 = sexp_bignum_shift(ctx,local_e8,local_b0);
    local_e8 = sexp_bignum_add(ctx,local_e8,local_e8,local_e0);
    local_e8 = sexp_bignum_add(ctx,local_e8,local_e8,local_c0);
    (ctx->value).context.saves = local_a8.next;
  }
  (local_e8->value).flonum_bits[0] = (b->value).flonum_bits[0] * (a->value).flonum_bits[0];
  return local_e8;
}

Assistant:

sexp sexp_bignum_mul (sexp ctx, sexp dst, sexp a, sexp b) {
  sexp_uint_t alen=sexp_bignum_hi(a), blen=sexp_bignum_hi(b), k,
    *bdata=sexp_bignum_data(b);
  sexp_gc_var7(a0, a1, b0, b1, z0, z1, z2);
  if (alen < blen) return sexp_bignum_mul(ctx, dst, b, a);
  if (blen == 1) {
    z1 = sexp_bignum_fxmul(ctx, dst, a, bdata[0], 0);
  } else {
    /* karatsuba:                             */
    /*   ab = (a1B^k + a0) * (b1B^k + b0)     */
    /*      = z2B^2k + z1B^k + z0             */
    /* where:                                 */
    /*   z2 = a1b1                            */
    /*   z1 = a1b0 + a0b1                     */
    /*   z0 = a0b0                            */
    /* then optimize further:                 */
    /*   z1 = (a1 + a0)(b1 + b0) - z2 - z0    */
    sexp_gc_preserve7(ctx, a0, a1, b0, b1, z0, z1, z2);
    k = blen / 2;
    sexp_bignum_split(ctx, a, k, &a0, &a1);
    sexp_bignum_split(ctx, b, k, &b0, &b1);
    z0 = sexp_bignum_add(ctx, NULL, a1, a0);  /* temp */
    z1 = sexp_bignum_add(ctx, NULL, b1, b0);
    z1 = sexp_bignum_mul(ctx, NULL, z1, z0);  /* 1 */
    z0 = sexp_bignum_mul(ctx, NULL, a0, b0);  /* 2 */
    z2 = sexp_bignum_mul(ctx, NULL, a1, b1);  /* 3 */
    z1 = sexp_bignum_sub(ctx, NULL, z1, z0);
    z1 = sexp_bignum_sub(ctx, NULL, z1, z2);
    z2 = sexp_bignum_shift(ctx, z2, 2*k);
    z1 = sexp_bignum_shift(ctx, z1, k);
    z1 = sexp_bignum_add(ctx, z1, z1, z0);
    z1 = sexp_bignum_add(ctx, z1, z1, z2);
    sexp_gc_release7(ctx);
  }
  sexp_bignum_sign(z1) = sexp_bignum_sign(a) * sexp_bignum_sign(b);
  return z1;
}